

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

int32 __thiscall StackSym::GetIntConstValue(StackSym *this)

{
  Instr *instr;
  Opnd *this_00;
  Var aValue;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int32 iVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  IntConstOpnd *this_01;
  AddrOpnd *pAVar7;
  double value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    bVar2 = IsIntConst(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x245,"(this->IsIntConst())","this->IsIntConst()");
      if (!bVar2) goto LAB_005b8885;
      *puVar5 = 0;
    }
    instr = (this->field_5).m_instrDef;
    this_00 = instr->m_src1;
    bVar2 = IR::Opnd::IsIntConstOpnd(this_00);
    if (bVar2) {
      uVar3 = instr->m_opcode - 0x1e4;
      if ((10 < uVar3) || ((0x403U >> (uVar3 & 0x1f) & 1) == 0)) {
        bVar2 = LowererMD::IsAssign(instr);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                             ,0x24b,
                             "(defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr))"
                             ,
                             "defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr)"
                            );
          if (!bVar2) goto LAB_005b8885;
          *puVar5 = 0;
        }
      }
      this_01 = IR::Opnd::AsIntConstOpnd(this_00);
      iVar4 = IR::IntConstOpnd::AsInt32(this_01);
      return iVar4;
    }
    bVar2 = IR::Opnd::IsAddrOpnd(this_00);
    if (bVar2) break;
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x25e,"(src1->IsRegOpnd())","src1->IsRegOpnd()");
      if (!bVar2) goto LAB_005b8885;
      *puVar5 = 0;
    }
    pRVar6 = IR::Opnd::AsRegOpnd(this_00);
    this = pRVar6->m_sym;
  }
  if (instr->m_opcode != Ld_A) {
    bVar2 = LowererMD::IsAssign(instr);
    if (((!bVar2) && (instr->m_opcode != ArgOut_A)) && (instr->m_opcode != ArgOut_A_InlineBuiltIn))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x251,
                         "(defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn)"
                         ,
                         "defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn"
                        );
      if (!bVar2) goto LAB_005b8885;
      *puVar5 = 0;
    }
  }
  pAVar7 = IR::Opnd::AsAddrOpnd(this_00);
  if ((pAVar7->addrOpndKind != AddrOpndKindConstantVar) &&
     (pAVar7->addrOpndKind != AddrOpndKindDynamicVar)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x253,"(addr->IsVar())","addr->IsVar()");
    if (!bVar2) goto LAB_005b8885;
    *puVar5 = 0;
  }
  pAVar7 = IR::Opnd::AsAddrOpnd(this_00);
  aValue = pAVar7->m_address;
  bVar2 = Js::TaggedInt::Is(aValue);
  if (bVar2) {
    iVar4 = Js::TaggedInt::ToInt32(aValue);
    return iVar4;
  }
  uStack_38 = CONCAT44(0xcccccccc,(undefined4)uStack_38);
  value = Js::JavascriptNumber::GetValue(aValue);
  bVar2 = Js::JavascriptNumber::TryGetInt32Value<false>(value,(int32 *)((long)&uStack_38 + 4));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x25b,"(isInt32)","isInt32");
    if (!bVar2) {
LAB_005b8885:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return uStack_38._4_4_;
}

Assistant:

int32
StackSym::GetIntConstValue() const
{
    Assert(this->IsIntConst());
    IR::Instr *defInstr = this->m_instrDef;
    IR::Opnd *src1 = defInstr->GetSrc1();

    if (src1->IsIntConstOpnd())
    {
        Assert(defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr));
        return src1->AsIntConstOpnd()->AsInt32();
    }

    if (src1->IsAddrOpnd())
    {
        Assert(defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn);
        IR::AddrOpnd *addr = src1->AsAddrOpnd();
        Assert(addr->IsVar());
        Js::Var var = src1->AsAddrOpnd()->m_address;
        if (Js::TaggedInt::Is(var))
        {
            return Js::TaggedInt::ToInt32(var);
        }
        int32 value = 0xCCCCCCCC;
        const bool isInt32 = Js::JavascriptNumber::TryGetInt32Value(Js::JavascriptNumber::GetValue(var), &value);
        Assert(isInt32);
        return value;
    }
    Assert(src1->IsRegOpnd());
    return src1->AsRegOpnd()->m_sym->GetIntConstValue();
}